

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

void __thiscall
QMainWindowLayout::setTabPosition
          (QMainWindowLayout *this,DockWidgetAreas areas,TabPosition tabPosition)

{
  Shape shape;
  QMainWindowLayout *pQVar1;
  long lVar2;
  QMainWindowLayout *pQVar3;
  QMainWindowLayout *pQVar4;
  long in_FS_OFFSET;
  undefined8 uStack_48;
  undefined8 uStack_40;
  long lStack_30;
  
  if (((uint)areas.super_QFlagsStorageHelper<Qt::DockWidgetArea,_4>.
             super_QFlagsStorage<Qt::DockWidgetArea>.i & 4) == 4) {
    *(TabPosition *)(this + 0x76c) = tabPosition;
  }
  if (((uint)areas.super_QFlagsStorageHelper<Qt::DockWidgetArea,_4>.
             super_QFlagsStorage<Qt::DockWidgetArea>.i & 1) != 0) {
    *(TabPosition *)(this + 0x764) = tabPosition;
  }
  if (((uint)areas.super_QFlagsStorageHelper<Qt::DockWidgetArea,_4>.
             super_QFlagsStorage<Qt::DockWidgetArea>.i & 8) != 0) {
    *(TabPosition *)(this + 0x770) = tabPosition;
  }
  if (((uint)areas.super_QFlagsStorageHelper<Qt::DockWidgetArea,_4>.
             super_QFlagsStorage<Qt::DockWidgetArea>.i & 2) != 0) {
    *(TabPosition *)(this + 0x768) = tabPosition;
    updateTabBarShapes(this);
    return;
  }
  pQVar3 = (QMainWindowLayout *)&uStack_48;
  lStack_30 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_48 = 0x300000002;
  uStack_40 = 0x100000000;
  pQVar4 = this + 0x764;
  lVar2 = 0;
  do {
    pQVar1 = pQVar4;
    if (this[0x738] != (QMainWindowLayout)0x0) {
      pQVar1 = pQVar3;
    }
    shape = _q_tb_tabBarShapeFrom(*(TabShape *)(this + 0x774),*(TabPosition *)pQVar1);
    QDockAreaLayoutInfo::setTabBarShape((QDockAreaLayoutInfo *)(this + lVar2 + 0x1e0),shape);
    pQVar3 = pQVar3 + 4;
    pQVar4 = pQVar4 + 4;
    lVar2 = lVar2 + 0x70;
  } while (lVar2 != 0x1c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lStack_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayout::setTabPosition(Qt::DockWidgetAreas areas, QTabWidget::TabPosition tabPosition)
{
    const Qt::DockWidgetArea dockWidgetAreas[] = {
        Qt::TopDockWidgetArea,
        Qt::LeftDockWidgetArea,
        Qt::BottomDockWidgetArea,
        Qt::RightDockWidgetArea
    };
    const QInternal::DockPosition dockPositions[] = {
        QInternal::TopDock,
        QInternal::LeftDock,
        QInternal::BottomDock,
        QInternal::RightDock
    };

    for (int i = 0; i < QInternal::DockCount; ++i)
        if (areas & dockWidgetAreas[i])
            tabPositions[dockPositions[i]] = tabPosition;

    updateTabBarShapes();
}